

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall
duckdb::CSVReaderOptions::SetDateFormat
          (CSVReaderOptions *this,LogicalTypeId type,string *format,bool read_format)

{
  pointer pcVar1;
  pointer pSVar2;
  int iVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  InvalidInputException *this_02;
  size_t __n;
  string error;
  StrpTimeFormat strpformat;
  string auto_format;
  LogicalTypeId local_1a1;
  char *local_1a0;
  long local_198;
  char local_190 [16];
  undefined1 local_180 [48];
  element_type *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  idx_t local_128;
  vector<int,_std::allocator<int>_> local_120;
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  char local_90 [16];
  _Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68 [24];
  idx_t local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_198 = 0;
  local_190[0] = '\0';
  local_1a1 = type;
  local_1a0 = local_190;
  StringUtil::Lower(&local_e8,format);
  iVar3 = ::std::__cxx11::string::compare((char *)&local_e8);
  if (iVar3 != 0) {
    if (read_format) {
      StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)local_180);
      StrTimeFormat::ParseFormatSpecifier(&local_c8,format,(StrTimeFormat *)local_180);
      ::std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      this_00 = ::std::
                map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                ::operator[](&(this->dialect_options).date_format,&local_1a1);
      local_a8 = (undefined1  [8])&PTR__StrTimeFormat_0249c2d0;
      local_a0._M_p = local_90;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_180._8_8_,(pointer)(local_180._8_8_ + local_180._16_8_));
      local_80._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::_Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::
      _M_create_storage(&local_80,(long)local_150 - local_180._40_8_);
      pSVar2 = local_80._M_impl.super__Vector_impl_data._M_start;
      __n = (long)local_150 - local_180._40_8_;
      if (__n != 0) {
        memmove(local_80._M_impl.super__Vector_impl_data._M_start,(void *)local_180._40_8_,__n);
      }
      local_80._M_impl.super__Vector_impl_data._M_finish = pSVar2 + __n;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(local_68,&local_140);
      local_50 = local_128;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_48,&local_120);
      local_a8 = (undefined1  [8])&PTR__StrTimeFormat_0249c348;
      CSVOption<duckdb::StrpTimeFormat>::Set(this_00,(StrpTimeFormat *)local_a8,true);
      StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_a8);
      StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_180);
    }
    else {
      pcVar1 = (format->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,pcVar1 + format->_M_string_length);
      Value::Value((Value *)local_180,&local_108);
      this_01 = ::std::
                map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                ::operator[](&this->write_date_format,&local_1a1);
      Value::operator=(this_01,(Value *)local_180);
      Value::~Value((Value *)local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
    }
    if (local_198 != 0) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Could not parse DATEFORMAT: %s","");
      InvalidInputException::InvalidInputException<char_const*>
                (this_02,(string *)local_180,local_1a0);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  return;
}

Assistant:

void CSVReaderOptions::SetDateFormat(LogicalTypeId type, const string &format, bool read_format) {
	string error;
	const string auto_format = StringUtil::Lower(format);
	if (auto_format != "auto") {
		if (read_format) {
			StrpTimeFormat strpformat;
			error = StrTimeFormat::ParseFormatSpecifier(format, strpformat);
			dialect_options.date_format[type].Set(strpformat);
		} else {
			write_date_format[type] = Value(format);
		}
		if (!error.empty()) {
			throw InvalidInputException("Could not parse DATEFORMAT: %s", error.c_str());
		}
	}
}